

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O3

bool __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64(CodedInputStream *this,uint64 *value)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  ulong uVar9;
  
  puVar4 = this->buffer_;
  if ((puVar4 < this->buffer_end_) && (-1 < (long)(char)*puVar4)) {
    *value = (long)(char)*puVar4;
    this->buffer_ = puVar4 + 1;
    return true;
  }
  pbVar2 = this->buffer_;
  pbVar3 = this->buffer_end_;
  iVar6 = (int)pbVar2;
  if (((int)pbVar3 - iVar6 < 10) && ((pbVar3 <= pbVar2 || ((char)pbVar3[-1] < '\0')))) {
    lVar13 = 0;
    uVar8 = 0;
    do {
      if (lVar13 == 10) {
        return false;
      }
      while (pbVar2 = this->buffer_, pbVar2 == this->buffer_end_) {
        bVar5 = Refresh(this);
        if (!bVar5) {
          return false;
        }
      }
      bVar1 = *pbVar2;
      uVar8 = uVar8 | (ulong)(bVar1 & 0x7f) << ((char)lVar13 * '\a' & 0x3fU);
      this->buffer_ = pbVar2 + 1;
      lVar13 = lVar13 + 1;
    } while ((char)bVar1 < '\0');
    *value = uVar8;
    return true;
  }
  uVar10 = *pbVar2 & 0x7f;
  uVar9 = 0;
  uVar8 = 0;
  if ((char)*pbVar2 < '\0') {
    uVar10 = uVar10 | (pbVar2[1] & 0x7f) << 7;
    if ((char)pbVar2[1] < '\0') {
      uVar10 = uVar10 | (pbVar2[2] & 0x7f) << 0xe;
      if ((char)pbVar2[2] < '\0') {
        uVar10 = uVar10 | (pbVar2[3] & 0x7f) << 0x15;
        if ((char)pbVar2[3] < '\0') {
          uVar11 = pbVar2[4] & 0x7f;
          if ((char)pbVar2[4] < '\0') {
            uVar11 = uVar11 | (pbVar2[5] & 0x7f) << 7;
            if ((char)pbVar2[5] < '\0') {
              uVar11 = uVar11 | (pbVar2[6] & 0x7f) << 0xe;
              if ((char)pbVar2[6] < '\0') {
                uVar11 = uVar11 | (pbVar2[7] & 0x7f) << 0x15;
                if ((char)pbVar2[7] < '\0') {
                  uVar7 = pbVar2[8] & 0x7f;
                  uVar8 = (ulong)uVar7;
                  if ((char)pbVar2[8] < '\0') {
                    if ((char)pbVar2[9] < '\0') {
                      return false;
                    }
                    iVar12 = iVar6 + 10;
                    uVar8 = (ulong)((pbVar2[9] & 0x7f) << 7 | uVar7);
                  }
                  else {
                    iVar12 = iVar6 + 9;
                  }
                }
                else {
                  iVar12 = iVar6 + 8;
                }
              }
              else {
                iVar12 = iVar6 + 7;
              }
            }
            else {
              iVar12 = iVar6 + 6;
              uVar8 = uVar9;
            }
          }
          else {
            iVar12 = iVar6 + 5;
            uVar8 = uVar9;
          }
          goto LAB_001c6ba8;
        }
        iVar12 = iVar6 + 4;
      }
      else {
        iVar12 = iVar6 + 3;
      }
    }
    else {
      iVar12 = iVar6 + 2;
    }
  }
  else {
    iVar12 = iVar6 + 1;
  }
  uVar11 = 0;
  uVar8 = uVar9;
LAB_001c6ba8:
  this->buffer_ = pbVar2 + (iVar12 - iVar6);
  *value = uVar8 << 0x38 | (ulong)uVar11 << 0x1c | (ulong)uVar10;
  return true;
}

Assistant:

inline bool CodedInputStream::ReadVarint64(uint64* value) {
  if (GOOGLE_PREDICT_TRUE(buffer_ < buffer_end_) && *buffer_ < 0x80) {
    *value = *buffer_;
    Advance(1);
    return true;
  } else {
    return ReadVarint64Fallback(value);
  }
}